

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

void * address_space_map_sparc64
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict7 *puVar1;
  byte bVar2;
  MemoryRegion *pMVar3;
  MemoryRegion *pMVar4;
  void *pvVar5;
  hwaddr done;
  hwaddr hVar6;
  undefined1 lock;
  hwaddr *plen_00;
  hwaddr hVar7;
  hwaddr l;
  hwaddr xlat;
  hwaddr xlat_1;
  ulong local_70;
  hwaddr local_68;
  MemTxAttrs local_5c;
  AddressSpace *local_58;
  FlatView *local_50;
  hwaddr *local_48;
  ram_addr_t local_40;
  hwaddr local_38;
  
  hVar7 = *plen;
  if (hVar7 == 0) {
    return (void *)0x0;
  }
  plen_00 = &local_70;
  local_50 = as->current_map;
  local_70 = hVar7;
  local_5c = attrs;
  local_58 = as;
  pMVar3 = flatview_translate_sparc64
                     ((uc_struct_conflict9 *)as,local_50,addr,&local_40,plen_00,is_write,attrs);
  bVar2 = pMVar3->ram;
  if (is_write) {
    if ((_Bool)bVar2 == false) goto LAB_00a1a81c;
    bVar2 = pMVar3->readonly ^ 1;
  }
  if (bVar2 != 0) {
    local_68 = local_70;
    hVar6 = 0;
    local_48 = plen;
    while( true ) {
      lock = SUB81(plen_00,0);
      hVar6 = hVar6 + local_68;
      hVar7 = hVar7 - local_68;
      if (hVar7 == 0) break;
      addr = addr + local_68;
      plen_00 = &local_68;
      local_68 = hVar7;
      pMVar4 = flatview_translate_sparc64
                         ((uc_struct_conflict9 *)as,local_50,addr,&local_38,plen_00,is_write,
                          local_5c);
      lock = SUB81(plen_00,0);
      if ((pMVar4 != pMVar3) || (local_38 != local_40 + hVar6)) break;
    }
    *local_48 = hVar6;
    pvVar5 = qemu_ram_ptr_length((uc_struct_conflict9 *)local_58->uc,pMVar3->ram_block,local_40,
                                 local_48,(_Bool)lock);
    return pvVar5;
  }
LAB_00a1a81c:
  if (0x1fff < local_70) {
    local_70 = 0x2000;
  }
  pvVar5 = qemu_memalign(0x2000,local_70);
  puVar1 = pMVar3->uc;
  (puVar1->bounce).buffer = pvVar5;
  (puVar1->bounce).addr = addr;
  (puVar1->bounce).len = local_70;
  (puVar1->bounce).mr = (MemoryRegion_conflict *)pMVar3;
  if (!is_write) {
    flatview_read((uc_struct_conflict9 *)local_58->uc,local_50,addr,(MemTxAttrs)0x1,pvVar5,local_70)
    ;
  }
  *plen = local_70;
  return (pMVar3->uc->bounce).buffer;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}